

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setGlobal(CommonCore *this,string_view valueName,string_view value)

{
  string_view string1;
  size_t in_RCX;
  BrokerBase *in_RDI;
  char *in_R8;
  ActionMessage querycmd;
  ActionMessage *in_stack_fffffffffffffee8;
  action_t in_stack_ffffffffffffff0c;
  ActionMessage *in_stack_ffffffffffffff10;
  undefined4 uVar1;
  GlobalFederateId in_stack_ffffffffffffff1c;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  uVar1 = 1;
  GlobalFederateId::GlobalFederateId
            ((GlobalFederateId *)&stack0xffffffffffffff1c,(GlobalBrokerId)0x1);
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT44(in_stack_ffffffffffffff1c.gid,uVar1),
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10);
  string1._M_str = in_R8;
  string1._M_len = in_RCX;
  ActionMessage::setStringData((ActionMessage *)in_RDI,string1);
  BrokerBase::addActionMessage(in_RDI,in_stack_fffffffffffffee8);
  ActionMessage::~ActionMessage((ActionMessage *)in_RDI);
  return;
}

Assistant:

void CommonCore::setGlobal(std::string_view valueName, std::string_view value)
{
    ActionMessage querycmd(CMD_SET_GLOBAL);
    querycmd.dest_id = gRootBrokerID;
    querycmd.source_id = gDirectCoreId;
    querycmd.payload = valueName;
    querycmd.setStringData(value);
    addActionMessage(std::move(querycmd));
}